

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem_lib.cc
# Opt level: O0

int PEM_write(FILE *fp,char *name,char *hdr,uchar *data,long len)

{
  BIO *bp;
  int ret;
  BIO *b;
  long len_local;
  uchar *data_local;
  char *header_local;
  char *name_local;
  FILE *fp_local;
  
  bp = BIO_new_fp(fp,0);
  if (bp == (BIO *)0x0) {
    ERR_put_error(9,0,7,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pem/pem_lib.cc"
                  ,0x1d8);
    fp_local._4_4_ = 0;
  }
  else {
    fp_local._4_4_ = PEM_write_bio(bp,name,hdr,data,len);
    BIO_free(bp);
  }
  return fp_local._4_4_;
}

Assistant:

int PEM_write(FILE *fp, const char *name, const char *header,
              const unsigned char *data, long len) {
  BIO *b = BIO_new_fp(fp, BIO_NOCLOSE);
  if (b == NULL) {
    OPENSSL_PUT_ERROR(PEM, ERR_R_BUF_LIB);
    return 0;
  }
  int ret = PEM_write_bio(b, name, header, data, len);
  BIO_free(b);
  return ret;
}